

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldDataFilter.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::MinefieldDataFilter::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,MinefieldDataFilter *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Minefield Data Filter:",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tGround Offset: ",0x11);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tWater Offset: ",0x10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tSnow Offset: ",0xf);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tMine Orientation: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tThermal Contrast: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tReflectance: ",0xf);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tMine Emplacement Age: ",0x18);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tTrip / Detonation Wire: ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tFusing: ",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\n\tScalar Detection Coefficient: ",0x20);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tPaint Scheme: ",0x10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString MinefieldDataFilter::GetAsString() const
{
    KStringStream ss;

    ss << "Minefield Data Filter:"
       << "\n\tGround Offset: "                 << m_FilterUnion.m_ui32GroundOffset
       << "\n\tWater Offset: "                  << m_FilterUnion.m_ui32WaterOffset
       << "\n\tSnow Offset: "                   << m_FilterUnion.m_ui32SnowOffset
       << "\n\tMine Orientation: "              << m_FilterUnion.m_ui32MineOri
       << "\n\tThermal Contrast: "              << m_FilterUnion.m_ui32ThermalCon
       << "\n\tReflectance: "                   << m_FilterUnion.m_ui32Reflectance
       << "\n\tMine Emplacement Age: "          << m_FilterUnion.m_ui32MineEmpAge
       << "\n\tTrip / Detonation Wire: "        << m_FilterUnion.m_ui32TripDetWire
       << "\n\tFusing: "                        << m_FilterUnion.m_ui32Fusing
       << "\n\tScalar Detection Coefficient: "  << m_FilterUnion.m_ui32ScalarDet
       << "\n\tPaint Scheme: "                  << m_FilterUnion.m_ui32PaintScm
       << "\n";

    return ss.str();
}